

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void trace_flushroot(jit_State *J,GCtrace *T)

{
  uint64_t uVar1;
  uint64_t local_28;
  GCtrace *T2;
  GCproto *pt;
  GCtrace *T_local;
  jit_State *J_local;
  
  uVar1 = (T->startpt).gcptr64;
  trace_unpatch(J,T);
  if (*(TraceNo1 *)(uVar1 + 0x3e) == T->traceno) {
    *(TraceNo1 *)(uVar1 + 0x3e) = T->nextroot;
  }
  else if ((*(short *)(uVar1 + 0x3e) != 0) &&
          (local_28 = J->trace[*(ushort *)(uVar1 + 0x3e)].gcptr64, local_28 != 0)) {
    for (; *(short *)(local_28 + 0x6e) != 0;
        local_28 = J->trace[*(ushort *)(local_28 + 0x6e)].gcptr64) {
      if (*(TraceNo1 *)(local_28 + 0x6e) == T->traceno) {
        *(TraceNo1 *)(local_28 + 0x6e) = T->nextroot;
        return;
      }
    }
  }
  return;
}

Assistant:

static void trace_flushroot(jit_State *J, GCtrace *T)
{
  GCproto *pt = &gcref(T->startpt)->pt;
  lj_assertJ(T->root == 0, "not a root trace");
  lj_assertJ(pt != NULL, "trace has no prototype");
  /* First unpatch any modified bytecode. */
  trace_unpatch(J, T);
  /* Unlink root trace from chain anchored in prototype. */
  if (pt->trace == T->traceno) {  /* Trace is first in chain. Easy. */
    pt->trace = T->nextroot;
  } else if (pt->trace) {  /* Otherwise search in chain of root traces. */
    GCtrace *T2 = traceref(J, pt->trace);
    if (T2) {
      for (; T2->nextroot; T2 = traceref(J, T2->nextroot))
	if (T2->nextroot == T->traceno) {
	  T2->nextroot = T->nextroot;  /* Unlink from chain. */
	  break;
	}
    }
  }
}